

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Transpose
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  EVP_PKEY_CTX *src;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  uchar *puVar8;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,width,height);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,height,width);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar2 = out->_rowSize;
  if (width * uVar2 != 0) {
    uVar3 = in->_rowSize;
    puVar4 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar2);
    puVar8 = puVar4 + width * uVar2;
    puVar5 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar3);
    do {
      if (height != 0) {
        uVar6 = 0;
        puVar7 = puVar5;
        do {
          uVar1 = *puVar7;
          puVar7 = puVar7 + uVar3;
          puVar4[uVar6] = uVar1;
          uVar6 = uVar6 + 1;
        } while (height != uVar6);
      }
      puVar4 = puVar4 + uVar2;
      puVar5 = puVar5 + 1;
    } while (puVar4 != puVar8);
  }
  return;
}

Assistant:

void Transpose( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );
        ParameterValidation( out, startXOut, startYOut, height, width );
        VerifyGrayScaleImage( in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inX  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + width * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, ++inX ) {
            const uint8_t * inY  = inX;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + height;

            for( ; outX != outXEnd; ++outX, inY += rowSizeIn )
                (*outX) = *(inY);
        }
    }